

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  MCOperand *op;
  uint16_t *puVar4;
  DecodeStatus DVar5;
  long lVar6;
  uint local_44;
  
  uVar2 = MCInst_getOpcode(Inst);
  local_44 = 0;
  if ((int)uVar2 < 0x93e) {
    bVar1 = false;
    if ((7 < uVar2 - 0x8f) || (bVar1 = false, (0xa5U >> (uVar2 - 0x8f & 0x1f) & 1) == 0))
    goto LAB_0015210c;
  }
  else {
    bVar1 = false;
    if ((int)uVar2 < 0xa24) {
      if ((uVar2 != 0x93e) && (uVar2 != 0x941)) goto LAB_0015210c;
    }
    else if ((uVar2 != 0xa26) && (uVar2 != 0xa24)) goto LAB_0015210c;
  }
  op = MCInst_getOperand(Inst,0);
  local_44 = MCOperand_getReg(op);
  bVar1 = true;
LAB_0015210c:
  if (Val != 0) {
    DVar5 = MCDisassembler_Success;
    puVar4 = GPRDecoderTable;
    lVar6 = 0;
    do {
      if ((((Val >> ((uint)lVar6 & 0x1f) & 1) != 0) &&
          (MCOperand_CreateReg0(Inst,(uint)*puVar4), bVar1)) &&
         (uVar3 = MCOperand_getReg(Inst->Operands + ((ulong)Inst->size - 1)), local_44 == uVar3)) {
        DVar5 = MCDisassembler_SoftFail;
      }
      lVar6 = lVar6 + 1;
      puVar4 = puVar4 + 1;
    } while (lVar6 != 0x10);
    if (local_44 != 0xc || uVar2 != 0x941) {
      return DVar5;
    }
    if ((~Val & 0xc000) != 0 && (Val >> 0xd & 1) == 0) {
      return DVar5;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	unsigned i;
	DecodeStatus S = MCDisassembler_Success;
	unsigned opcode;

	bool NeedDisjointWriteback = false;
	unsigned WritebackReg = 0;

	opcode = MCInst_getOpcode(Inst);
	switch (opcode) {
		default:
			break;
		case ARM_LDMIA_UPD:
		case ARM_LDMDB_UPD:
		case ARM_LDMIB_UPD:
		case ARM_LDMDA_UPD:
		case ARM_t2LDMIA_UPD:
		case ARM_t2LDMDB_UPD:
		case ARM_t2STMIA_UPD:
		case ARM_t2STMDB_UPD:
			NeedDisjointWriteback = true;
			WritebackReg = MCOperand_getReg(MCInst_getOperand(Inst, 0));
			break;
	}

	// Empty register lists are not allowed.
	if (Val == 0) return MCDisassembler_Fail;
	for (i = 0; i < 16; ++i) {
		if (Val & (1 << i)) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, i, Address, Decoder)))
				return MCDisassembler_Fail;
			// Writeback not allowed if Rn is in the target list.
			if (NeedDisjointWriteback && WritebackReg == MCOperand_getReg(&(Inst->Operands[Inst->size-1])))
				Check(&S, MCDisassembler_SoftFail);
		}
	}

	if (opcode == ARM_t2LDMIA_UPD && WritebackReg == ARM_SP) {
		if (Val & (1 << 13) || ((Val & (1 << 15)) && (Val & (1 << 14)))) {
			// invalid thumb2 pop
			// needs no sp in reglist and not both pc and lr set at the same time
			return MCDisassembler_Fail;
		}
	}

	return S;
}